

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

int check_evasion(CHAR_DATA *ch,int chance)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OBJ_DATA *pOVar5;
  OBJ_DATA *pOVar6;
  
  pOVar5 = get_eq_char(ch,0x10);
  pOVar6 = get_eq_char(ch,0x12);
  iVar2 = get_skill(ch,(int)gsn_evasion);
  if ((1 < iVar2) && (iVar3 = get_curr_stat(ch,3), 0x12 < iVar3)) {
    if ((pOVar5 != (OBJ_DATA *)0x0) &&
       (sVar1 = pOVar5->weight, iVar4 = skirmisher_max_weapweight(ch), iVar4 < sVar1)) {
      return chance;
    }
    if ((pOVar6 != (OBJ_DATA *)0x0) &&
       (sVar1 = pOVar6->weight, iVar4 = skirmisher_max_weapweight(ch), iVar4 < sVar1)) {
      return chance;
    }
    iVar4 = number_percent();
    if (iVar4 <= iVar2) {
      check_improve(ch,(int)gsn_evasion,true,5);
      iVar2 = (int)((float)(100 - chance) * ((float)(iVar3 + -0x12) * -0.05 + 1.0));
      chance = (ch->size * -10 - iVar2) + 0x78;
      if (ch->size < 3) {
        chance = 100 - iVar2;
      }
    }
  }
  return chance;
}

Assistant:

int check_evasion(CHAR_DATA *ch, int chance)
{
	int skill, dex;
	float nododge = 100 - chance; // chance of NOT dodging
	OBJ_DATA *weapon, *dual;

	weapon = get_eq_char(ch, WEAR_WIELD);
	dual = get_eq_char(ch, WEAR_DUAL_WIELD);

	skill = get_skill(ch, gsn_evasion);

	if (skill <= 1)
		return chance;

	dex = get_curr_stat(ch, STAT_DEX);

	if (dex <= 18)
		return chance;

	if (weapon != nullptr)
	{
		if (weapon->weight > skirmisher_max_weapweight(ch))
			return chance;
	}

	if (dual != nullptr)
	{
		if (dual->weight > skirmisher_max_weapweight(ch))
			return chance;
	}

	if (number_percent() > skill)
	{
		return chance;
	}
	else
	{
		nododge *= ((float)1 - 0.05 * (float)(dex - 18));
		check_improve(ch, gsn_evasion, true, 5);
		chance = 100 - (int)nododge;

		if (ch->size > SIZE_MEDIUM)
			chance -= (ch->size - SIZE_MEDIUM) * 10;
	}

	return chance;
}